

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_s.cpp
# Opt level: O1

void sscal(int n,float sa,float *x,int incx)

{
  float *pfVar1;
  uint uVar2;
  ulong uVar3;
  
  if (0 < n) {
    if (incx == 1) {
      uVar2 = (uint)n % 5;
      if (uVar2 != 0) {
        uVar3 = 0;
        do {
          x[uVar3] = x[uVar3] * sa;
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
      }
      if ((int)uVar2 < n) {
        pfVar1 = (float *)((long)x + (ulong)(uint)n * 4 + (ulong)(((uint)n / 5) * 4) * -5 + 0x10);
        uVar2 = (uint)n % 5;
        do {
          pfVar1[-4] = pfVar1[-4] * sa;
          pfVar1[-3] = pfVar1[-3] * sa;
          pfVar1[-2] = pfVar1[-2] * sa;
          pfVar1[-1] = pfVar1[-1] * sa;
          *pfVar1 = *pfVar1 * sa;
          pfVar1 = pfVar1 + 5;
          uVar2 = uVar2 + 5;
        } while ((int)uVar2 < n);
      }
    }
    else {
      pfVar1 = x + (incx >> 0x1f & (1 - n) * incx);
      do {
        *pfVar1 = *pfVar1 * sa;
        pfVar1 = pfVar1 + incx;
        n = n + -1;
      } while (n != 0);
    }
  }
  return;
}

Assistant:

void sscal ( int n, float sa, float x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    SSCAL scales a float vector by a constant.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 February 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, float SA, the multiplier.
//
//    Input/output, float X[*], the vector to be scaled.
//
//    Input, int INCX, the increment between successive entries of X.
//
{
  int i;
  int ix;
  int m;

  if ( n <= 0 )
  {
  }
  else if ( incx == 1 )
  {
    m = n % 5;

    for ( i = 0; i < m; i++ )
    {
      x[i] = sa * x[i];
    }

    for ( i = m; i < n; i = i + 5 )
    {
      x[i]   = sa * x[i];
      x[i+1] = sa * x[i+1];
      x[i+2] = sa * x[i+2];
      x[i+3] = sa * x[i+3];
      x[i+4] = sa * x[i+4];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    for ( i = 0; i < n; i++ )
    {
      x[ix] = sa * x[ix];
      ix = ix + incx;
    }

  }

  return;
}